

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-blend.c
# Opt level: O0

void plutovg_blend_gradient
               (plutovg_canvas_t *canvas,plutovg_gradient_paint_t *gradient,
               plutovg_span_buffer_t *span_buffer)

{
  float opacity_00;
  float fVar1;
  float fVar2;
  int iVar3;
  plutovg_gradient_stop_t *ppVar4;
  _Bool _Var5;
  uint32_t uVar6;
  uint32_t uVar7;
  plutovg_gradient_stop_t *ppVar8;
  plutovg_gradient_stop_t *ppVar9;
  float local_10ac;
  float opacity;
  float fpos;
  float incr;
  float t;
  float delta;
  uint32_t idist;
  uint32_t dist;
  uint32_t last_color;
  uint32_t next_color;
  uint32_t curr_color;
  plutovg_gradient_stop_t *last;
  plutovg_gradient_stop_t *start;
  plutovg_gradient_stop_t *next;
  plutovg_gradient_stop_t *curr;
  int nstops;
  int pos;
  int i;
  gradient_data_t data;
  plutovg_state_t *state;
  plutovg_span_buffer_t *span_buffer_local;
  plutovg_gradient_paint_t *gradient_local;
  plutovg_canvas_t *canvas_local;
  
  if (gradient->nstops != 0) {
    data.values._16_8_ = canvas->state;
    data.matrix.e = (float)gradient->spread;
    pos = (gradient->matrix).a;
    unique0x00012004 = (gradient->matrix).b;
    data.matrix.a = (gradient->matrix).c;
    data.matrix.b = (gradient->matrix).d;
    data.matrix.c = (gradient->matrix).e;
    data.matrix.d = (gradient->matrix).f;
    plutovg_matrix_multiply
              ((plutovg_matrix_t *)&pos,(plutovg_matrix_t *)&pos,
               &((plutovg_state_t *)data.values._16_8_)->matrix);
    _Var5 = plutovg_matrix_invert((plutovg_matrix_t *)&pos,(plutovg_matrix_t *)&pos);
    if (_Var5) {
      iVar3 = gradient->nstops;
      opacity_00 = *(float *)(data.values._16_8_ + 0x8c);
      ppVar4 = gradient->stops;
      last_color = premultiply_color_with_opacity(&ppVar4->color,opacity_00);
      curr._4_4_ = 1;
      data.matrix.f = (float)last_color;
      for (local_10ac = 0.0014648438; local_10ac <= ppVar4->offset;
          local_10ac = local_10ac + 0.0009765625) {
        data.colortable[(long)curr._4_4_ + -2] = data.colortable[(long)(curr._4_4_ + -1) + -2];
        curr._4_4_ = curr._4_4_ + 1;
      }
      for (nstops = 0; nstops < iVar3 + -1; nstops = nstops + 1) {
        ppVar8 = ppVar4 + nstops;
        ppVar9 = ppVar4 + (long)nstops + 1;
        if ((ppVar8->offset != ppVar9->offset) ||
           (uVar6 = last_color, NAN(ppVar8->offset) || NAN(ppVar9->offset))) {
          fVar1 = ppVar9->offset;
          fVar2 = ppVar8->offset;
          uVar6 = premultiply_color_with_opacity(&ppVar4[(long)nstops + 1].color,opacity_00);
          for (; local_10ac < ppVar9->offset && curr._4_4_ < 0x400;
              local_10ac = local_10ac + 0.0009765625) {
            uVar7 = (uint32_t)
                    (long)((local_10ac - ppVar8->offset) * (1.0 / (fVar1 - fVar2)) * 255.0);
            uVar7 = INTERPOLATE_PIXEL(last_color,0xff - uVar7,uVar6,uVar7);
            data.colortable[(long)curr._4_4_ + -2] = uVar7;
            curr._4_4_ = curr._4_4_ + 1;
          }
        }
        last_color = uVar6;
      }
      uVar6 = premultiply_color_with_opacity(&ppVar4[(long)iVar3 + -1].color,opacity_00);
      for (; curr._4_4_ < 0x400; curr._4_4_ = curr._4_4_ + 1) {
        data.colortable[(long)curr._4_4_ + -2] = uVar6;
      }
      if (gradient->type == PLUTOVG_GRADIENT_TYPE_LINEAR) {
        data.colortable[0x3fe] = (uint32_t)gradient->values[0];
        data.colortable[0x3ff] = (uint32_t)gradient->values[1];
        data.values.linear.x1 = gradient->values[2];
        data.values.linear.y1 = gradient->values[3];
        blend_linear_gradient
                  (canvas->surface,*(plutovg_operator_t *)(data.values._16_8_ + 0x84),
                   (gradient_data_t *)&pos,span_buffer);
      }
      else {
        data.colortable[0x3fe] = (uint32_t)gradient->values[0];
        data.colortable[0x3ff] = (uint32_t)gradient->values[1];
        data.values.linear.x1 = gradient->values[2];
        data.values.linear.y1 = gradient->values[3];
        data.values.linear.x2 = gradient->values[4];
        data.values.linear.y2 = gradient->values[5];
        blend_radial_gradient
                  (canvas->surface,*(plutovg_operator_t *)(data.values._16_8_ + 0x84),
                   (gradient_data_t *)&pos,span_buffer);
      }
    }
  }
  return;
}

Assistant:

static void plutovg_blend_gradient(plutovg_canvas_t* canvas, const plutovg_gradient_paint_t* gradient, const plutovg_span_buffer_t* span_buffer)
{
    if(gradient->nstops == 0)
        return;
    plutovg_state_t* state = canvas->state;
    gradient_data_t data;
    data.spread = gradient->spread;
    data.matrix = gradient->matrix;
    plutovg_matrix_multiply(&data.matrix, &data.matrix, &state->matrix);
    if(!plutovg_matrix_invert(&data.matrix, &data.matrix))
        return;
    int i, pos = 0, nstops = gradient->nstops;
    const plutovg_gradient_stop_t *curr, *next, *start, *last;
    uint32_t curr_color, next_color, last_color;
    uint32_t dist, idist;
    float delta, t, incr, fpos;
    float opacity = state->opacity;

    start = gradient->stops;
    curr = start;
    curr_color = premultiply_color_with_opacity(&curr->color, opacity);

    data.colortable[pos++] = curr_color;
    incr = 1.0f / COLOR_TABLE_SIZE;
    fpos = 1.5f * incr;

    while(fpos <= curr->offset) {
        data.colortable[pos] = data.colortable[pos - 1];
        ++pos;
        fpos += incr;
    }

    for(i = 0; i < nstops - 1; i++) {
        curr = (start + i);
        next = (start + i + 1);
        if(curr->offset == next->offset)
            continue;
        delta = 1.f / (next->offset - curr->offset);
        next_color = premultiply_color_with_opacity(&next->color, opacity);
        while(fpos < next->offset && pos < COLOR_TABLE_SIZE) {
            t = (fpos - curr->offset) * delta;
            dist = (uint32_t)(255 * t);
            idist = 255 - dist;
            data.colortable[pos] = INTERPOLATE_PIXEL(curr_color, idist, next_color, dist);
            ++pos;
            fpos += incr;
        }

        curr_color = next_color;
    }

    last = start + nstops - 1;
    last_color = premultiply_color_with_opacity(&last->color, opacity);
    for(; pos < COLOR_TABLE_SIZE; ++pos) {
        data.colortable[pos] = last_color;
    }

    if(gradient->type == PLUTOVG_GRADIENT_TYPE_LINEAR) {
        data.values.linear.x1 = gradient->values[0];
        data.values.linear.y1 = gradient->values[1];
        data.values.linear.x2 = gradient->values[2];
        data.values.linear.y2 = gradient->values[3];
        blend_linear_gradient(canvas->surface, state->op, &data, span_buffer);
    } else {
        data.values.radial.cx = gradient->values[0];
        data.values.radial.cy = gradient->values[1];
        data.values.radial.cr = gradient->values[2];
        data.values.radial.fx = gradient->values[3];
        data.values.radial.fy = gradient->values[4];
        data.values.radial.fr = gradient->values[5];
        blend_radial_gradient(canvas->surface, state->op, &data, span_buffer);
    }
}